

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unix.h
# Opt level: O0

bool MakeErrMsg(string *ErrMsg,string *prefix,int errnum)

{
  uint *puVar1;
  int errnum_00;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint local_24;
  string *psStack_20;
  int errnum_local;
  string *prefix_local;
  string *ErrMsg_local;
  
  if (ErrMsg != (string *)0x0) {
    local_24 = errnum;
    psStack_20 = prefix;
    prefix_local = ErrMsg;
    if (errnum == -1) {
      puVar1 = (uint *)__errno_location();
      local_24 = *puVar1;
    }
    std::operator+(&local_68,psStack_20,": ");
    llvm::sys::StrError_abi_cxx11_(&local_88,(sys *)(ulong)local_24,errnum_00);
    std::operator+(&local_48,&local_68,&local_88);
    std::__cxx11::string::operator=((string *)prefix_local,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return true;
}

Assistant:

static inline bool MakeErrMsg(
  std::string* ErrMsg, const std::string& prefix, int errnum = -1) {
  if (!ErrMsg)
    return true;
  if (errnum == -1)
    errnum = errno;
  *ErrMsg = prefix + ": " + llvm::sys::StrError(errnum);
  return true;
}